

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ShortcutsWindow.cpp
# Opt level: O1

bool __thiscall
cursespp::ShortcutsWindow::ProcessMouseEvent(ShortcutsWindow *this,Event *mouseEvent)

{
  int iVar1;
  pointer psVar2;
  element_type *peVar3;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  pointer pcVar4;
  bool bVar5;
  pointer psVar6;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  if ((mouseEvent->state & 4) != 0) {
    psVar2 = (this->entries).
             super__Vector_base<std::shared_ptr<cursespp::ShortcutsWindow::Entry>,_std::allocator<std::shared_ptr<cursespp::ShortcutsWindow::Entry>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    for (psVar6 = (this->entries).
                  super__Vector_base<std::shared_ptr<cursespp::ShortcutsWindow::Entry>,_std::allocator<std::shared_ptr<cursespp::ShortcutsWindow::Entry>_>_>
                  ._M_impl.super__Vector_impl_data._M_start; bVar5 = psVar6 != psVar2, bVar5;
        psVar6 = psVar6 + 1) {
      peVar3 = (psVar6->
               super___shared_ptr<cursespp::ShortcutsWindow::Entry,_(__gnu_cxx::_Lock_policy)2>).
               _M_ptr;
      this_00 = (psVar6->
                super___shared_ptr<cursespp::ShortcutsWindow::Entry,_(__gnu_cxx::_Lock_policy)2>).
                _M_refcount._M_pi;
      if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          this_00->_M_use_count = this_00->_M_use_count + 1;
          UNLOCK();
        }
        else {
          this_00->_M_use_count = this_00->_M_use_count + 1;
        }
      }
      iVar1 = (peVar3->position).offset;
      if ((iVar1 <= mouseEvent->x) && (mouseEvent->x < iVar1 + (peVar3->position).width)) {
        std::__cxx11::string::_M_assign((string *)&this->activeKey);
        (*(this->super_Window).super_IWindow.super_IOrderable._vptr_IOrderable[5])(this);
        if ((this->changedCallback).super__Function_base._M_manager != (_Manager_type)0x0) {
          pcVar4 = (this->activeKey)._M_dataplus._M_p;
          local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_50,pcVar4,pcVar4 + (this->activeKey)._M_string_length);
          if ((this->changedCallback).super__Function_base._M_manager == (_Manager_type)0x0) {
            std::__throw_bad_function_call();
          }
          (*(this->changedCallback)._M_invoker)((_Any_data *)&this->changedCallback,&local_50);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_50._M_dataplus._M_p != &local_50.field_2) {
            operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
          }
        }
        if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
        }
        if (bVar5) {
          return true;
        }
        break;
      }
      if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
      }
    }
  }
  bVar5 = Window::ProcessMouseEvent(&this->super_Window,mouseEvent);
  return bVar5;
}

Assistant:

bool ShortcutsWindow::ProcessMouseEvent(const IMouseHandler::Event& mouseEvent) {
    if (mouseEvent.Button1Clicked()) {
        for (auto entry : this->entries) {
            auto& pos = entry->position;
            if (mouseEvent.x >= pos.offset &&
                mouseEvent.x < pos.offset + pos.width)
            {
                this->activeKey = entry->key;

                this->Redraw();

                if (this->changedCallback) {
                    this->changedCallback(this->activeKey);
                }

                return true;
            }
        }
    }
    return Window::ProcessMouseEvent(mouseEvent);
}